

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O0

void __thiscall cmCTestLaunchReporter::ComputeFileNames(cmCTestLaunchReporter *this)

{
  bool bVar1;
  ulong uVar2;
  string_view sVar3;
  cmAlphaNum local_1b0;
  cmAlphaNum local_180;
  string local_150;
  cmAlphaNum local_130;
  cmAlphaNum local_100;
  string local_d0;
  string local_b0;
  string_view local_90;
  reference local_80;
  string *realArg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_50 [8];
  cmCryptoHash md5;
  undefined1 local_30 [8];
  string d;
  cmCTestLaunchReporter *this_local;
  
  d.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  bVar1 = cmsys::SystemTools::GetEnv("CTEST_LAUNCH_LOGS",(string *)local_30);
  if ((bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    this->Passthru = false;
    std::__cxx11::string::operator=((string *)&this->LogDir,(string *)local_30);
    cmsys::SystemTools::ConvertToUnixSlashes(&this->LogDir);
    std::__cxx11::string::operator+=((string *)&this->LogDir,"/");
    cmCryptoHash::cmCryptoHash((cmCryptoHash *)local_50,AlgoMD5);
    cmCryptoHash::Initialize((cmCryptoHash *)local_50);
    sVar3 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->CWD);
    cmCryptoHash::Append((cmCryptoHash *)local_50,sVar3);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->RealArgs);
    realArg = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->RealArgs);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&realArg);
      if (!bVar1) break;
      local_80 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
      sVar3 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_80);
      local_90 = sVar3;
      cmCryptoHash::Append((cmCryptoHash *)local_50,sVar3);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    cmCryptoHash::FinalizeHex_abi_cxx11_(&local_b0,(cmCryptoHash *)local_50);
    std::__cxx11::string::operator=((string *)&this->LogHash,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    cmAlphaNum::cmAlphaNum(&local_100,&this->LogDir);
    cmAlphaNum::cmAlphaNum(&local_130,"launch-");
    cmStrCat<std::__cxx11::string,char[9]>
              (&local_d0,&local_100,&local_130,&this->LogHash,(char (*) [9])"-out.txt");
    std::__cxx11::string::operator=((string *)&this->LogOut,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    cmAlphaNum::cmAlphaNum(&local_180,&this->LogDir);
    cmAlphaNum::cmAlphaNum(&local_1b0,"launch-");
    cmStrCat<std::__cxx11::string,char[9]>
              (&local_150,&local_180,&local_1b0,&this->LogHash,(char (*) [9])"-err.txt");
    std::__cxx11::string::operator=((string *)&this->LogErr,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    cmCryptoHash::~cmCryptoHash((cmCryptoHash *)local_50);
    md5.CTX._0_4_ = 0;
  }
  else {
    md5.CTX._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmCTestLaunchReporter::ComputeFileNames()
{
  // We just passthru the behavior of the real command unless the
  // CTEST_LAUNCH_LOGS environment variable is set.
  std::string d;
  if (!cmSystemTools::GetEnv("CTEST_LAUNCH_LOGS", d) || d.empty()) {
    return;
  }
  this->Passthru = false;

  // The environment variable specifies the directory into which we
  // generate build logs.
  this->LogDir = d;
  cmSystemTools::ConvertToUnixSlashes(this->LogDir);
  this->LogDir += "/";

  // We hash the input command working dir and command line to obtain
  // a repeatable and (probably) unique name for log files.
  cmCryptoHash md5(cmCryptoHash::AlgoMD5);
  md5.Initialize();
  md5.Append(this->CWD);
  for (std::string const& realArg : this->RealArgs) {
    md5.Append(realArg);
  }
  this->LogHash = md5.FinalizeHex();

  // We store stdout and stderr in temporary log files.
  this->LogOut = cmStrCat(this->LogDir, "launch-", this->LogHash, "-out.txt");
  this->LogErr = cmStrCat(this->LogDir, "launch-", this->LogHash, "-err.txt");
}